

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O2

void __thiscall
net_tests::ipv4_peer_with_ipv6_addrMe_test::test_method(ipv4_peer_with_ipv6_addrMe_test *this)

{
  long lVar1;
  CService ipIn;
  CService ipIn_00;
  mapped_type *pmVar2;
  int *piVar3;
  CAddress *__args_5;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  check_type cVar7;
  undefined8 in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe38;
  int iVar4;
  undefined4 in_stack_fffffffffffffe3c;
  undefined8 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe48;
  undefined1 uVar5;
  undefined7 in_stack_fffffffffffffe49;
  undefined7 uVar6;
  shared_count sStack_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  undefined1 local_179;
  bool local_178 [4];
  undefined1 local_174 [4];
  unique_ptr<CNode,_std::default_delete<CNode>_> pnode;
  in_addr ipv4AddrPeer;
  in_addr raw_addr;
  _Optional_payload_base<CService> local_160;
  CService local_130;
  in6_addr ipv6AddrLocal;
  UniqueLock<GlobalMutex> criticalblock31;
  undefined1 *local_e8 [2];
  CAddress addrLocal;
  CService local_a0;
  CAddress addr;
  CNetAddr mapLocalHost_entry;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  raw_addr.s_addr = 0x100007f;
  CNetAddr::CNetAddr(&mapLocalHost_entry,&raw_addr);
  UniqueLock<GlobalMutex>::UniqueLock
            ((UniqueLock<GlobalMutex> *)&addr,&g_maplocalhost_mutex,"g_maplocalhost_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
             ,0x25c,false);
  pmVar2 = std::
           map<CNetAddr,_LocalServiceInfo,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
           ::operator[](&mapLocalHost,&mapLocalHost_entry);
  pmVar2->nScore = 0x17;
  pmVar2->nPort = 0x2a;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&addr);
  ipv4AddrPeer.s_addr = 0xa0b0c001;
  CService::CService(&local_a0,&ipv4AddrPeer,0x1e61);
  ipIn.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffffe30;
  ipIn.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)in_stack_fffffffffffffe28;
  ipIn.super_CNetAddr.m_addr._size = in_stack_fffffffffffffe38;
  ipIn.super_CNetAddr.m_addr._20_4_ = in_stack_fffffffffffffe3c;
  ipIn.super_CNetAddr.m_net = (int)in_stack_fffffffffffffe40;
  ipIn.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  ipIn.port._0_1_ = in_stack_fffffffffffffe48;
  ipIn._33_7_ = in_stack_fffffffffffffe49;
  CAddress::CAddress(&addr,ipIn,(ServiceFlags)&local_a0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_a0);
  ipv6AddrLocal.__in6_u._0_8_ = (ulong)ipv6AddrLocal.__in6_u.__u6_addr32[1] << 0x20;
  uVar5 = '\0';
  uVar6 = 0;
  iVar4 = 0;
  local_174 = (undefined1  [4])0x0;
  CAddress::CAddress(&addrLocal);
  criticalblock31.super_unique_lock._M_device = (mutex_type *)local_e8;
  criticalblock31.super_unique_lock._M_owns = false;
  criticalblock31.super_unique_lock._9_7_ = 0;
  local_e8[0] = (undefined1 *)((ulong)local_e8[0] & 0xffffffffffffff00);
  local_178[0] = true;
  local_178[1] = false;
  local_178[2] = false;
  local_178[3] = false;
  local_179 = 0;
  __args_5 = (CAddress *)local_174;
  piVar3 = (int *)&stack0xfffffffffffffe38;
  std::
  make_unique<CNode,int,decltype(nullptr),CAddress&,int,int,CAddress,std::__cxx11::string,ConnectionType,bool>
            ((int *)&pnode,(void **)&ipv6AddrLocal,(CAddress *)&stack0xfffffffffffffe48,(int *)&addr
             ,(int *)&stack0xfffffffffffffe38,__args_5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addrLocal,
             (ConnectionType *)&criticalblock31,local_178);
  std::__cxx11::string::~string((string *)&criticalblock31);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addrLocal);
  LOCK();
  *(undefined1 *)
   ((long)pnode._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t.
          super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
          super__Head_base<0UL,_CNode_*,_false>._M_head_impl + 0x219) = 1;
  UNLOCK();
  ipv6AddrLocal.__in6_u._8_8_ = 0;
  ipv6AddrLocal.__in6_u._0_8_ = 0xcc;
  CService::CService(&local_130,&ipv6AddrLocal,0x1e61);
  ipIn_00.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffffe30;
  ipIn_00.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffffe28;
  ipIn_00.super_CNetAddr.m_addr._size = iVar4;
  ipIn_00.super_CNetAddr.m_addr._20_4_ = in_stack_fffffffffffffe3c;
  ipIn_00.super_CNetAddr.m_net = (int)in_stack_fffffffffffffe40;
  ipIn_00.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  ipIn_00.port._0_1_ = uVar5;
  ipIn_00._33_7_ = uVar6;
  CAddress::CAddress(&addrLocal,ipIn_00,(ServiceFlags)&local_130);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_130);
  CNode::SetAddrLocal((CNode *)pnode._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>.
                               _M_t.super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                               super__Head_base<0UL,_CNode_*,_false>._M_head_impl,
                      &addrLocal.super_CService);
  GetLocalAddrForPeer((optional<CService> *)&local_160,
                      (CNode *)pnode._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>.
                               _M_t.super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                               super__Head_base<0UL,_CNode_*,_false>._M_head_impl);
  std::_Optional_payload_base<CService>::_M_reset(&local_160);
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x3f6c42;
  msg.m_end = (iterator)__args_5;
  msg.m_begin = (iterator)piVar3;
  file.m_end = (iterator)0x27d;
  file.m_begin = (iterator)&local_190;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1a0,msg);
  sStack_1a8.pi_ = (sp_counted_base *)0x0;
  criticalblock31.super_unique_lock._8_8_ =
       criticalblock31.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock31.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_0113a070;
  local_e8[0] = boost::unit_test::lazy_ostream::inst;
  local_e8[1] = &stack0xfffffffffffffe38;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&stack0xfffffffffffffe48,(lazy_ostream *)&criticalblock31,1,0,WARN,
             _cVar7,(size_t)&stack0xfffffffffffffe28,0x27d);
  boost::detail::shared_count::~shared_count(&sStack_1a8);
  UniqueLock<GlobalMutex>::UniqueLock
            (&criticalblock31,&g_maplocalhost_mutex,"g_maplocalhost_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
             ,0x281,false);
  std::
  _Rb_tree<CNetAddr,_std::pair<const_CNetAddr,_LocalServiceInfo>,_std::_Select1st<std::pair<const_CNetAddr,_LocalServiceInfo>_>,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
  ::erase(&mapLocalHost._M_t,&mapLocalHost_entry);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock31.super_unique_lock);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addrLocal);
  std::unique_ptr<CNode,_std::default_delete<CNode>_>::~unique_ptr(&pnode);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&mapLocalHost_entry.m_addr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ipv4_peer_with_ipv6_addrMe_test)
{
    // set up local addresses; all that's necessary to reproduce the bug is
    // that a normal IPv4 address is among the entries, but if this address is
    // !IsRoutable the undefined behavior is easier to trigger deterministically
    in_addr raw_addr;
    raw_addr.s_addr = htonl(0x7f000001);
    const CNetAddr mapLocalHost_entry = CNetAddr(raw_addr);
    {
        LOCK(g_maplocalhost_mutex);
        LocalServiceInfo lsi;
        lsi.nScore = 23;
        lsi.nPort = 42;
        mapLocalHost[mapLocalHost_entry] = lsi;
    }

    // create a peer with an IPv4 address
    in_addr ipv4AddrPeer;
    ipv4AddrPeer.s_addr = 0xa0b0c001;
    CAddress addr = CAddress(CService(ipv4AddrPeer, 7777), NODE_NETWORK);
    std::unique_ptr<CNode> pnode = std::make_unique<CNode>(/*id=*/0,
                                                           /*sock=*/nullptr,
                                                           addr,
                                                           /*nKeyedNetGroupIn=*/0,
                                                           /*nLocalHostNonceIn=*/0,
                                                           CAddress{},
                                                           /*pszDest=*/std::string{},
                                                           ConnectionType::OUTBOUND_FULL_RELAY,
                                                           /*inbound_onion=*/false);
    pnode->fSuccessfullyConnected.store(true);

    // the peer claims to be reaching us via IPv6
    in6_addr ipv6AddrLocal;
    memset(ipv6AddrLocal.s6_addr, 0, 16);
    ipv6AddrLocal.s6_addr[0] = 0xcc;
    CAddress addrLocal = CAddress(CService(ipv6AddrLocal, 7777), NODE_NETWORK);
    pnode->SetAddrLocal(addrLocal);

    // before patch, this causes undefined behavior detectable with clang's -fsanitize=memory
    GetLocalAddrForPeer(*pnode);

    // suppress no-checks-run warning; if this test fails, it's by triggering a sanitizer
    BOOST_CHECK(1);

    // Cleanup, so that we don't confuse other tests.
    {
        LOCK(g_maplocalhost_mutex);
        mapLocalHost.erase(mapLocalHost_entry);
    }
}